

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O3

size_t __thiscall
FlatFileSeq::Allocate(FlatFileSeq *this,FlatFilePos *pos,size_t add_size,bool *out_of_space)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  FILE *__stream;
  Logger *this_00;
  size_t additional_bytes;
  ulong uVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  size_t new_size;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *out_of_space = false;
  uVar4 = (ulong)pos->nPos;
  uVar1 = this->m_chunk_size;
  additional_bytes = 0;
  uVar2 = ((add_size + uVar4 + uVar1) - 1) / uVar1;
  if ((uint)(((uVar4 + uVar1) - 1) / uVar1) < (uint)uVar2) {
    new_size = (uVar2 & 0xffffffff) * uVar1;
    additional_bytes = new_size - uVar4;
    bVar3 = CheckDiskSpace(&this->m_dir,additional_bytes);
    if (bVar3) {
      __stream = (FILE *)Open(this,pos,false);
      if (__stream != (FILE *)0x0) {
        this_00 = LogInstance();
        bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,VALIDATION,Debug);
        if (bVar3) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/flatfile.cpp"
          ;
          source_file._M_len = 0x5c;
          logging_function._M_str = "Allocate";
          logging_function._M_len = 8;
          LogPrintFormatInternal<unsigned_long,char_const*,int>
                    (logging_function,source_file,0x45,VALIDATION,Debug,
                     (ConstevalFormatString<3U>)0x8166bd,&new_size,&this->m_prefix,&pos->nFile);
        }
        AllocateFileRange((FILE *)__stream,pos->nPos,(uint)additional_bytes);
        fclose(__stream);
        goto LAB_00455748;
      }
    }
    else {
      *out_of_space = true;
    }
    additional_bytes = 0;
  }
LAB_00455748:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return additional_bytes;
  }
  __stack_chk_fail();
}

Assistant:

size_t FlatFileSeq::Allocate(const FlatFilePos& pos, size_t add_size, bool& out_of_space) const
{
    out_of_space = false;

    unsigned int n_old_chunks = (pos.nPos + m_chunk_size - 1) / m_chunk_size;
    unsigned int n_new_chunks = (pos.nPos + add_size + m_chunk_size - 1) / m_chunk_size;
    if (n_new_chunks > n_old_chunks) {
        size_t old_size = pos.nPos;
        size_t new_size = n_new_chunks * m_chunk_size;
        size_t inc_size = new_size - old_size;

        if (CheckDiskSpace(m_dir, inc_size)) {
            FILE *file = Open(pos);
            if (file) {
                LogDebug(BCLog::VALIDATION, "Pre-allocating up to position 0x%x in %s%05u.dat\n", new_size, m_prefix, pos.nFile);
                AllocateFileRange(file, pos.nPos, inc_size);
                fclose(file);
                return inc_size;
            }
        } else {
            out_of_space = true;
        }
    }
    return 0;
}